

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,absl::lts_20250127::hash_internal::Hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::construct<std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,absl::lts_20250127::hash_internal::Hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
           *this,slot_type *slot,piecewise_construct_t *args,tuple<unsigned_long_&&> *args_1,
          tuple<> *args_2)

{
  size_t c;
  
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  (slot->value).first =
       *(args_1->super__Tuple_impl<0UL,_unsigned_long_&&>).
        super__Head_base<0UL,_unsigned_long_&&,_false>._M_head_impl;
  (slot->value).second = 0;
  CommonFields::set_capacity((CommonFields *)this,c);
  return;
}

Assistant:

void set_capacity(size_t c) {
    // We allow setting above the max valid capacity for debugging purposes.
    ABSL_SWISSTABLE_ASSERT(c == 0 || IsValidCapacity(c) ||
                           c > kAboveMaxValidCapacity);
    capacity_ = c;
  }